

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpivotgrowth.c
# Opt level: O0

float cPivotGrowth(int ncols,SuperMatrix *A,int *perm_c,SuperMatrix *L,SuperMatrix *U)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *addr;
  float fVar10;
  double dVar11;
  float local_e4;
  double local_d8;
  double local_c8;
  double local_b8;
  long local_a0;
  singlecomplex *luval;
  float smlnum;
  float maxuj;
  float maxaj;
  float rpg;
  int *inv_perm_c;
  int_t oldcol;
  int_t k;
  int_t j;
  int_t i;
  int_t nz_in_U;
  int_t luptr;
  int nsupr;
  int fsupc;
  singlecomplex *Uval;
  singlecomplex *Lval;
  singlecomplex *Aval;
  NCformat *Ustore;
  SCformat *Lstore;
  NCformat *Astore;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  int *perm_c_local;
  SuperMatrix *A_local;
  int ncols_local;
  
  fVar10 = smach("S");
  maxuj = 1.0 / fVar10;
  pvVar4 = A->Store;
  pvVar5 = L->Store;
  pvVar6 = U->Store;
  lVar7 = *(long *)((long)pvVar4 + 8);
  lVar8 = *(long *)((long)pvVar5 + 8);
  lVar9 = *(long *)((long)pvVar6 + 8);
  addr = superlu_malloc((long)A->ncol << 2);
  for (oldcol = 0; oldcol < A->ncol; oldcol = oldcol + 1) {
    *(int_t *)((long)addr + (long)perm_c[oldcol] * 4) = oldcol;
  }
  for (inv_perm_c._4_4_ = 0; inv_perm_c._4_4_ <= *(int *)((long)pvVar5 + 4);
      inv_perm_c._4_4_ = inv_perm_c._4_4_ + 1) {
    oldcol = *(int *)(*(long *)((long)pvVar5 + 0x30) + (long)inv_perm_c._4_4_ * 4);
    iVar1 = *(int *)(*(long *)((long)pvVar5 + 0x20) + (long)(oldcol + 1) * 4);
    iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x20) + (long)oldcol * 4);
    local_a0 = lVar8 + (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + (long)oldcol * 4) * 8;
    j = 1;
    for (; oldcol < *(int *)(*(long *)((long)pvVar5 + 0x30) + (long)(inv_perm_c._4_4_ + 1) * 4) &&
           oldcol < ncols; oldcol = oldcol + 1) {
      smlnum = 0.0;
      iVar3 = *(int *)((long)addr + (long)oldcol * 4);
      for (k = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)iVar3 * 4);
          k < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(iVar3 + 1) * 4); k = k + 1) {
        dVar11 = c_abs1((singlecomplex *)(lVar7 + (long)k * 8));
        if ((double)smlnum <= dVar11) {
          local_b8 = c_abs1((singlecomplex *)(lVar7 + (long)k * 8));
        }
        else {
          local_b8 = (double)smlnum;
        }
        smlnum = (float)local_b8;
      }
      luval._4_4_ = 0.0;
      for (k = *(int_t *)(*(long *)((long)pvVar6 + 0x18) + (long)oldcol * 4);
          k < *(int *)(*(long *)((long)pvVar6 + 0x18) + (long)(oldcol + 1) * 4); k = k + 1) {
        dVar11 = c_abs1((singlecomplex *)(lVar9 + (long)k * 8));
        if ((double)luval._4_4_ <= dVar11) {
          local_c8 = c_abs1((singlecomplex *)(lVar9 + (long)k * 8));
        }
        else {
          local_c8 = (double)luval._4_4_;
        }
        luval._4_4_ = (float)local_c8;
      }
      for (k = 0; k < j; k = k + 1) {
        dVar11 = c_abs1((singlecomplex *)(local_a0 + (long)k * 8));
        if ((double)luval._4_4_ <= dVar11) {
          local_d8 = c_abs1((singlecomplex *)(local_a0 + (long)k * 8));
        }
        else {
          local_d8 = (double)luval._4_4_;
        }
        luval._4_4_ = (float)local_d8;
      }
      j = j + 1;
      local_a0 = local_a0 + (long)(iVar1 - iVar2) * 8;
      if ((luval._4_4_ != 0.0) || (NAN(luval._4_4_))) {
        if (smlnum / luval._4_4_ <= maxuj) {
          local_e4 = smlnum / luval._4_4_;
        }
        else {
          local_e4 = maxuj;
        }
        maxuj = local_e4;
      }
      else if (1.0 <= maxuj) {
        maxuj = 1.0;
      }
    }
    if (ncols <= oldcol) break;
  }
  superlu_free(addr);
  return maxuj;
}

Assistant:

float
cPivotGrowth(int ncols, SuperMatrix *A, int *perm_c, 
             SuperMatrix *L, SuperMatrix *U)
{

    NCformat *Astore;
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex  *Aval, *Lval, *Uval;
    int      fsupc, nsupr;
    int_t    luptr, nz_in_U;
    int_t    i, j, k, oldcol;
    int      *inv_perm_c;
    float   rpg, maxaj, maxuj;
    float   smlnum;
    singlecomplex   *luval;
   
    /* Get machine constants. */
    smlnum = smach("S");
    rpg = 1. / smlnum;

    Astore = A->Store;
    Lstore = L->Store;
    Ustore = U->Store;
    Aval = Astore->nzval;
    Lval = Lstore->nzval;
    Uval = Ustore->nzval;
    
    inv_perm_c = (int *) SUPERLU_MALLOC(A->ncol*sizeof(int));
    for (j = 0; j < A->ncol; ++j) inv_perm_c[perm_c[j]] = j;

    for (k = 0; k <= Lstore->nsuper; ++k) {
	fsupc = L_FST_SUPC(k);
	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	luptr = L_NZ_START(fsupc);
	luval = &Lval[luptr];
	nz_in_U = 1;
	
	for (j = fsupc; j < L_FST_SUPC(k+1) && j < ncols; ++j) {
	    maxaj = 0.;
            oldcol = inv_perm_c[j];
	    for (i = Astore->colptr[oldcol]; i < Astore->colptr[oldcol+1]; ++i)
		maxaj = SUPERLU_MAX( maxaj, c_abs1( &Aval[i]) );
	
	    maxuj = 0.;
	    for (i = Ustore->colptr[j]; i < Ustore->colptr[j+1]; i++)
		maxuj = SUPERLU_MAX( maxuj, c_abs1( &Uval[i]) );
	    
	    /* Supernode */
	    for (i = 0; i < nz_in_U; ++i)
		maxuj = SUPERLU_MAX( maxuj, c_abs1( &luval[i]) );

	    ++nz_in_U;
	    luval += nsupr;

	    if ( maxuj == 0. )
		rpg = SUPERLU_MIN( rpg, 1.);
	    else
		rpg = SUPERLU_MIN( rpg, maxaj / maxuj );
	}
	
	if ( j >= ncols ) break;
    }

    SUPERLU_FREE(inv_perm_c);
    return (rpg);
}